

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O0

int vec_insert_(char **data,int *length,int *capacity,int memsz,int idx,char *alloc_category)

{
  int err;
  char *alloc_category_local;
  int idx_local;
  int memsz_local;
  int *capacity_local;
  int *length_local;
  char **data_local;
  
  data_local._4_4_ = vec_expand_(data,length,capacity,memsz,alloc_category);
  if (data_local._4_4_ == 0) {
    memmove(*data + (idx + 1) * memsz,*data + idx * memsz,(long)((*length - idx) * memsz));
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

int vec_insert_(char **data, int *length, int *capacity, int memsz,
                 int idx, const char *alloc_category
) {
  int err = vec_expand_(data, length, capacity, memsz, alloc_category);
  if (err) return err;
  memmove(*data + (idx + 1) * memsz,
          *data + idx * memsz,
          (*length - idx) * memsz);
  return 0;
}